

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  uint uVar2;
  uint uVar3;
  U32 UVar4;
  uint uVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  BYTE *pBVar8;
  ZSTD_matchState_t *pZVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  uint *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint *puVar19;
  BYTE *pBVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  byte *pInLimit;
  BYTE *pBVar34;
  uint uVar35;
  int iVar36;
  ulong local_100;
  uint *local_f8;
  uint *local_f0;
  U32 dummy32;
  uint local_5c;
  BYTE *local_58;
  uint *local_50;
  byte *local_48;
  BYTE *local_40;
  byte *local_38;
  
  pUVar6 = ms->hashTable;
  sVar13 = ZSTD_hashPtr(ip,(ms->cParams).hashLog,mls);
  pBVar7 = (ms->window).base;
  uVar35 = (int)ip - (int)pBVar7;
  uVar2 = (ms->window).lowLimit;
  uVar21 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar26 = uVar35 - uVar21;
  if (uVar35 < uVar21) {
    uVar26 = 0;
  }
  uVar27 = uVar2;
  if (uVar2 < uVar26) {
    uVar27 = uVar26;
  }
  uVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  local_50 = pUVar6 + sVar13;
  pUVar6 = ms->chainTable;
  puVar14 = local_50;
  uVar29 = uVar22;
  uVar30 = 0;
  while (uVar3 = *puVar14, uVar27 < uVar3) {
    puVar14 = pUVar6 + (uVar3 & uVar21) * 2;
    if ((puVar14[1] != 1) || (uVar29 < 2)) {
      if (puVar14[1] == 1) {
        puVar14[0] = 0;
        puVar14[1] = 0;
      }
      break;
    }
    puVar14[1] = uVar30;
    uVar29 = uVar29 - 1;
    uVar30 = uVar3;
  }
  do {
    if (uVar30 == 0) break;
    UVar4 = pUVar6[(ulong)((uVar30 & uVar21) * 2) + 1];
    uVar31 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    local_58 = (ms->window).dictBase;
    uVar3 = (ms->window).dictLimit;
    uVar33 = (ulong)uVar3;
    local_38 = local_58 + uVar33;
    pInLimit = iend;
    pBVar8 = pBVar7;
    if (uVar30 < uVar3) {
      pInLimit = local_38;
      pBVar8 = local_58;
    }
    local_40 = pBVar7 + uVar33;
    uVar11 = (uVar30 & uVar31) * 2;
    local_f8 = pUVar6 + uVar11;
    uVar24 = pUVar6[uVar11];
    uVar5 = (ms->window).lowLimit;
    uVar12 = 0;
    uVar23 = 0;
    puVar14 = pUVar6 + uVar11 + 1;
    uVar16 = 0;
    local_48 = pInLimit;
LAB_003a8761:
    if ((uVar29 == uVar12) || (uVar24 <= uVar5)) goto LAB_003a88c8;
    uVar15 = uVar16;
    if (uVar23 < uVar16) {
      uVar15 = uVar23;
    }
    uVar17 = (ulong)uVar24;
    pBVar34 = pBVar7;
    if (dictMode == ZSTD_extDict) {
      if ((uVar30 < uVar3) || (uVar33 <= uVar17 + uVar15)) {
        if (uVar17 + uVar15 < uVar33) {
          pBVar34 = local_58;
        }
        goto LAB_003a8811;
      }
      pBVar1 = local_58 + uVar17;
      sVar13 = ZSTD_count_2segments
                         (pBVar8 + uVar15 + uVar30,pBVar1 + uVar15,pInLimit,local_38,local_40);
      uVar15 = sVar13 + uVar15;
      pInLimit = local_48;
      pBVar34 = pBVar7 + uVar17;
      if (uVar15 + uVar17 < uVar33) {
        pBVar34 = pBVar1;
      }
    }
    else {
LAB_003a8811:
      sVar13 = ZSTD_count(pBVar8 + uVar15 + uVar30,pBVar34 + uVar17 + uVar15,pInLimit);
      uVar15 = sVar13 + uVar15;
      pBVar34 = pBVar34 + uVar17;
    }
    if (pBVar8 + uVar15 + uVar30 == pInLimit) goto LAB_003a88c8;
    puVar19 = pUVar6 + (uVar24 & uVar31) * 2;
    if (pBVar8[uVar15 + uVar30] <= pBVar34[uVar15]) {
      *puVar14 = uVar24;
      puVar14 = puVar19;
      if (uVar24 <= uVar27) {
        puVar14 = &local_5c;
        goto LAB_003a88c8;
      }
LAB_003a8893:
      uVar24 = *puVar14;
      uVar12 = uVar12 + 1;
      puVar14 = puVar19;
      uVar16 = uVar15;
      goto LAB_003a8761;
    }
    *local_f8 = uVar24;
    if (uVar27 < uVar24) {
      local_f8 = puVar19 + 1;
      puVar19 = puVar14;
      puVar14 = local_f8;
      uVar23 = uVar15;
      uVar15 = uVar16;
      goto LAB_003a8893;
    }
    local_f8 = &local_5c;
LAB_003a88c8:
    *puVar14 = 0;
    *local_f8 = 0;
    uVar29 = uVar29 + 1;
    uVar30 = UVar4;
  } while( true );
  pBVar8 = (ms->window).dictBase;
  uVar15 = (ulong)(ms->window).dictLimit;
  uVar16 = (ulong)((uVar21 & uVar35) * 2);
  local_f0 = pUVar6 + uVar16;
  iVar36 = uVar35 + 9;
  uVar27 = *local_50;
  *local_50 = uVar35;
  iVar25 = -uVar22;
  uVar23 = 0;
  uVar33 = 0;
  local_100 = 0;
  puVar14 = pUVar6 + uVar16 + 1;
  do {
    iVar25 = iVar25 + 1;
    uVar16 = (ulong)uVar27;
    if ((iVar25 == 1) || (uVar27 <= uVar2)) goto LAB_003a8b16;
    uVar17 = uVar33;
    if (uVar23 < uVar33) {
      uVar17 = uVar23;
    }
    if ((dictMode == ZSTD_extDict) && (uVar17 + uVar16 < uVar15)) {
      pBVar1 = pBVar8 + uVar16;
      sVar13 = ZSTD_count_2segments
                         (ip + uVar17,pBVar1 + uVar17,iend,pBVar8 + uVar15,pBVar7 + uVar15);
      uVar17 = sVar13 + uVar17;
      pBVar34 = pBVar7 + uVar16;
      if (uVar17 + uVar16 < uVar15) {
        pBVar34 = pBVar1;
      }
    }
    else {
      sVar13 = ZSTD_count(ip + uVar17,pBVar7 + uVar16 + uVar17,iend);
      uVar17 = sVar13 + uVar17;
      pBVar34 = pBVar7 + uVar16;
    }
    if (local_100 < uVar17) {
      if (iVar36 - uVar27 < uVar17) {
        iVar36 = uVar27 + (int)uVar17;
      }
      iVar18 = (int)uVar17 - (int)local_100;
      uVar29 = (uVar35 + 1) - uVar27;
      iVar32 = 0x1f;
      if (uVar29 != 0) {
        for (; uVar29 >> iVar32 == 0; iVar32 = iVar32 + -1) {
        }
      }
      uVar29 = (int)*offsetPtr + 1;
      iVar28 = 0x1f;
      if (uVar29 != 0) {
        for (; uVar29 >> iVar28 == 0; iVar28 = iVar28 + -1) {
        }
      }
      if (iVar32 - iVar28 < iVar18 * 4) {
        *offsetPtr = (ulong)((uVar35 + 2) - uVar27);
        local_100 = uVar17;
      }
      if (ip + uVar17 == iend) {
        iVar25 = -iVar25;
        if (dictMode == ZSTD_dictMatchState) {
          iVar25 = 0;
        }
        goto LAB_003a8b1d;
      }
    }
    puVar19 = pUVar6 + (uVar27 & uVar21) * 2;
    if (pBVar34[uVar17] < ip[uVar17]) {
      *local_f0 = uVar27;
      if (uVar27 <= uVar26) {
        local_f0 = &dummy32;
LAB_003a8b16:
        iVar25 = -iVar25;
LAB_003a8b1d:
        *puVar14 = 0;
        *local_f0 = 0;
        if ((dictMode == ZSTD_dictMatchState) && (iVar25 != 0)) {
          pZVar9 = ms->dictMatchState;
          pUVar6 = pZVar9->hashTable;
          sVar13 = ZSTD_hashPtr(ip,(pZVar9->cParams).hashLog,mls);
          puVar14 = pUVar6 + sVar13;
          uVar2 = (ms->window).dictLimit;
          pBVar8 = (pZVar9->window).nextSrc;
          pBVar34 = (pZVar9->window).base;
          uVar33 = (long)pBVar8 - (long)pBVar34;
          uVar21 = (pZVar9->window).lowLimit;
          iVar32 = (int)uVar33;
          uVar29 = (ms->window).lowLimit - iVar32;
          uVar27 = ~(-1 << ((char)(pZVar9->cParams).chainLog - 1U & 0x1f));
          uVar26 = iVar32 - uVar27;
          if (iVar32 - uVar21 <= uVar27) {
            uVar26 = uVar21;
          }
          pUVar6 = pZVar9->chainTable;
          uVar16 = 0;
          uVar23 = 0;
          while( true ) {
            iVar25 = -iVar25;
            while( true ) {
              iVar25 = iVar25 + 1;
              if (iVar25 == 1) goto LAB_003a8d06;
              uVar30 = *puVar14;
              uVar15 = (ulong)uVar30;
              if (uVar30 <= uVar21) goto LAB_003a8d06;
              uVar17 = uVar16;
              if (uVar23 < uVar16) {
                uVar17 = uVar23;
              }
              pBVar1 = pBVar34 + uVar15;
              sVar13 = ZSTD_count_2segments(ip + uVar17,pBVar1 + uVar17,iend,pBVar8,pBVar7 + uVar2);
              uVar17 = sVar13 + uVar17;
              pBVar20 = pBVar7 + uVar15 + uVar29;
              if (uVar17 + uVar15 < (uVar33 & 0xffffffff)) {
                pBVar20 = pBVar1;
              }
              if (local_100 < uVar17) {
                iVar18 = uVar29 + uVar30;
                iVar28 = (int)uVar17 - (int)local_100;
                uVar22 = (uVar35 + 1) - iVar18;
                iVar32 = 0x1f;
                if (uVar22 != 0) {
                  for (; uVar22 >> iVar32 == 0; iVar32 = iVar32 + -1) {
                  }
                }
                uVar22 = (int)*offsetPtr + 1;
                iVar10 = 0x1f;
                if (uVar22 != 0) {
                  for (; uVar22 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                  }
                }
                if (iVar32 - iVar10 < iVar28 * 4) {
                  *offsetPtr = (ulong)((uVar35 + 2) - iVar18);
                  local_100 = uVar17;
                }
                if (ip + uVar17 == iend) goto LAB_003a8d06;
              }
              puVar14 = pUVar6 + (uVar30 & uVar27) * 2;
              if (pBVar20[uVar17] < ip[uVar17]) break;
              uVar16 = uVar17;
              if (uVar30 <= uVar26) goto LAB_003a8d06;
            }
            if (uVar30 <= uVar26) break;
            iVar25 = -iVar25;
            puVar14 = puVar14 + 1;
            uVar23 = uVar17;
          }
        }
LAB_003a8d06:
        ms->nextToUpdate = iVar36 - 8;
        return local_100;
      }
      local_f0 = puVar19 + 1;
      puVar19 = puVar14;
      puVar14 = local_f0;
      uVar23 = uVar17;
    }
    else {
      *puVar14 = uVar27;
      uVar33 = uVar17;
      puVar14 = puVar19;
      if (uVar27 <= uVar26) {
        puVar14 = &dummy32;
        goto LAB_003a8b16;
      }
    }
    uVar27 = *puVar14;
    puVar14 = puVar19;
  } while( true );
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offsetPtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ms->window.lowLimit;

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offsetPtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}